

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_tree(REF_INTERP ref_interp,REF_BOOL *increase_fuzz)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  REF_INT RVar4;
  uint cell;
  REF_MPI ref_mpi;
  REF_GRID pRVar5;
  REF_NODE pRVar6;
  REF_SEARCH pRVar7;
  REF_CELL pRVar8;
  REF_GLOB *pRVar9;
  REF_INTERP ref_interp_00;
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar12;
  void *pvVar13;
  REF_DBL *pRVar14;
  REF_DBL *pRVar15;
  REF_INT *pRVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined8 uVar20;
  long lVar21;
  REF_INT RVar22;
  long lVar23;
  char *pcVar24;
  ulong uVar25;
  int iVar27;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  REF_INT total_node;
  REF_INT *local_190;
  REF_INT *local_188;
  void *local_180;
  REF_SEARCH local_178;
  REF_DBL *local_170;
  REF_DBL *global_xyz;
  REF_INT nrecv;
  REF_DBL *local_158;
  REF_INT *source;
  REF_LIST ref_list;
  void *local_140;
  void *local_138;
  void *local_130;
  REF_NODE local_128;
  void *local_120;
  int *local_118;
  REF_GRID local_110;
  REF_NODE local_108;
  REF_DBL *recv_bary;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  void *local_d8;
  REF_CELL local_d0;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar5 = ref_interp->from_grid;
  local_108 = pRVar5->node;
  pRVar6 = ref_interp->to_grid->node;
  pRVar7 = ref_interp->ref_search;
  pRVar8 = (&ref_interp->from_tet)[pRVar5->twod != 0];
  *increase_fuzz = 0;
  uVar11 = ref_list_create(&ref_list);
  if (uVar11 == 0) {
    iVar27 = pRVar6->max;
    uVar25 = (ulong)iVar27;
    local_178 = pRVar7;
    local_118 = increase_fuzz;
    local_110 = pRVar5;
    local_d0 = pRVar8;
    if ((long)uVar25 < 1) {
      uVar11 = 0;
    }
    else {
      uVar17 = 0;
      uVar11 = 0;
      do {
        if ((-1 < pRVar6->global[uVar17]) && (pRVar6->ref_mpi->id == pRVar6->part[uVar17])) {
          uVar11 = uVar11 + (ref_interp->cell[uVar17] == -1);
        }
        uVar17 = uVar17 + 1;
      } while (uVar25 != uVar17);
      if ((int)uVar11 < 0) {
        pcVar24 = "malloc local_node of REF_INT negative";
        uVar20 = 0x4a3;
        goto LAB_00159499;
      }
    }
    pvVar13 = malloc((ulong)uVar11 << 2);
    if (pvVar13 == (void *)0x0) {
      pcVar24 = "malloc local_node of REF_INT NULL";
      uVar20 = 0x4a3;
LAB_001595b1:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar20,"ref_interp_tree",pcVar24);
      return 2;
    }
    local_120 = pvVar13;
    pvVar13 = malloc((ulong)(uVar11 * 3) << 3);
    if (pvVar13 == (void *)0x0) {
      pcVar24 = "malloc local_xyz of REF_DBL NULL";
      uVar20 = 0x4a4;
      goto LAB_001595b1;
    }
    if (iVar27 < 1) {
      RVar22 = 0;
    }
    else {
      pRVar9 = pRVar6->global;
      uVar17 = 0;
      lVar21 = 2;
      RVar22 = 0;
      do {
        if (((-1 < pRVar9[uVar17]) && (pRVar6->ref_mpi->id == pRVar6->part[uVar17])) &&
           (ref_interp->cell[uVar17] == -1)) {
          *(int *)((long)local_120 + (long)RVar22 * 4) = (int)uVar17;
          pRVar14 = pRVar6->real;
          lVar23 = (long)(RVar22 * 3);
          *(REF_DBL *)((long)pvVar13 + lVar23 * 8) = pRVar14[lVar21 + -2];
          *(REF_DBL *)((long)pvVar13 + lVar23 * 8 + 8) = pRVar14[lVar21 + -1];
          *(REF_DBL *)((long)pvVar13 + lVar23 * 8 + 0x10) = pRVar14[lVar21];
          RVar22 = RVar22 + 1;
        }
        uVar17 = uVar17 + 1;
        lVar21 = lVar21 + 0xf;
      } while (uVar17 < uVar25);
    }
    local_128 = pRVar6;
    uVar11 = ref_mpi_allconcat(ref_mpi,3,RVar22,pvVar13,&total_node,&source,&global_xyz,3);
    if (uVar11 == 0) {
      local_d8 = pvVar13;
      if (source != (REF_INT *)0x0) {
        free(source);
      }
      uVar11 = ref_mpi_allconcat(ref_mpi,1,RVar22,local_120,&total_node,&source,&global_node,1);
      RVar22 = total_node;
      if (uVar11 == 0) {
        lVar21 = (long)total_node;
        if (lVar21 < 0) {
          pcVar24 = "malloc best_bary of REF_DBL negative";
          uVar20 = 0x4b7;
LAB_00159499:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar20,"ref_interp_tree",pcVar24);
          return 1;
        }
        pRVar14 = (REF_DBL *)malloc(lVar21 * 8);
        if (pRVar14 == (REF_DBL *)0x0) {
          pcVar24 = "malloc best_bary of REF_DBL NULL";
          uVar20 = 0x4b7;
          goto LAB_001595b1;
        }
        sVar1 = lVar21 * 4;
        local_130 = malloc(sVar1);
        if (local_130 == (void *)0x0) {
          pcVar24 = "malloc best_node of REF_INT NULL";
          uVar20 = 0x4b8;
          goto LAB_001595b1;
        }
        pRVar15 = (REF_DBL *)malloc(sVar1);
        if (pRVar15 == (REF_DBL *)0x0) {
          pcVar24 = "malloc best_cell of REF_INT NULL";
          uVar20 = 0x4b9;
          goto LAB_001595b1;
        }
        local_170 = pRVar15;
        pRVar16 = (REF_INT *)malloc(sVar1);
        if (pRVar16 == (REF_INT *)0x0) {
          pcVar24 = "malloc from_proc of REF_INT NULL";
          uVar20 = 0x4ba;
          goto LAB_001595b1;
        }
        if (RVar22 == 0) {
          RVar22 = 0;
        }
        else {
          pvVar13 = (void *)0x0;
          lVar21 = 0;
          pRVar15 = local_170;
          local_190 = pRVar16;
          local_158 = pRVar14;
          do {
            *(REF_INT *)((long)local_130 + lVar21 * 4) = global_node[lVar21];
            *(undefined4 *)pRVar15 = 0xffffffff;
            pRVar14[lVar21] = 1e+20;
            local_180 = pvVar13;
            uVar11 = ref_search_touching(local_178,ref_list,
                                         (REF_DBL *)((long)global_xyz + (long)pvVar13),
                                         ref_interp->search_fuzz);
            if (uVar11 != 0) {
              pcVar24 = "tch";
              uVar20 = 0x4c1;
              goto LAB_001593fd;
            }
            if (ref_list->n < 1) {
              *(undefined4 *)pRVar15 = 0xffffffff;
            }
            else {
              ref_interp_00 = (REF_INTERP)ref_interp->from_grid->node;
              if (local_110->twod == 0) {
                uVar11 = ref_interp_enclosing_tet_in_list
                                   (ref_interp_00,(REF_LIST)ref_interp->from_tet,(REF_DBL *)ref_list
                                    ,(REF_INT *)((long)global_xyz + (long)local_180),pRVar15);
                if (uVar11 != 0) {
                  pcVar24 = "best in list";
                  uVar20 = 0x4cc;
                  goto LAB_001593fd;
                }
              }
              else {
                uVar11 = ref_interp_enclosing_tri_in_list
                                   (ref_interp_00,(REF_LIST)ref_interp->from_tri,(REF_DBL *)ref_list
                                    ,(REF_INT *)((long)global_xyz + (long)local_180),pRVar15);
                if (uVar11 != 0) {
                  pcVar24 = "best in list";
                  uVar20 = 0x4c7;
                  goto LAB_001593fd;
                }
              }
              pRVar14 = local_158;
              if (*(int *)pRVar15 != -1) {
                dVar2 = bary[0];
                if (bary[1] <= bary[0]) {
                  dVar2 = bary[1];
                }
                dVar3 = bary[2];
                if (bary[3] <= bary[2]) {
                  dVar3 = bary[3];
                }
                if (dVar3 <= dVar2) {
                  dVar2 = dVar3;
                }
                local_158[lVar21] = -dVar2;
              }
            }
            ref_interp->tree_cells = ref_interp->tree_cells + ref_list->n;
            uVar11 = ref_list_erase(ref_list);
            if (uVar11 != 0) {
              pcVar24 = "reset list";
              uVar20 = 0x4d6;
              goto LAB_001593fd;
            }
            lVar21 = lVar21 + 1;
            pvVar13 = (void *)((long)local_180 + 0x18);
            pRVar15 = (REF_DBL *)((long)pRVar15 + 4);
            pRVar16 = local_190;
            RVar22 = total_node;
          } while (lVar21 < total_node);
        }
        uVar11 = ref_mpi_allminwho(ref_mpi,pRVar14,pRVar16,RVar22);
        RVar22 = total_node;
        if (uVar11 == 0) {
          uVar25 = (ulong)total_node;
          if ((long)uVar25 < 1) {
            uVar17 = 0;
          }
          else {
            uVar18 = 0;
            uVar17 = 0;
            do {
              uVar17 = (ulong)((int)uVar17 + (uint)(ref_mpi->id == pRVar16[uVar18]));
              uVar18 = uVar18 + 1;
            } while (uVar25 != uVar18);
          }
          local_190 = pRVar16;
          local_178 = (REF_SEARCH)malloc((ulong)(uint)((int)uVar17 * 4) << 3);
          if (local_178 == (REF_SEARCH)0x0) {
            pcVar24 = "malloc send_bary of REF_DBL NULL";
            uVar20 = 0x4e0;
            goto LAB_001595b1;
          }
          sVar1 = uVar17 * 4;
          local_180 = malloc(sVar1);
          if (local_180 == (void *)0x0) {
            pcVar24 = "malloc send_cell of REF_INT NULL";
            uVar20 = 0x4e1;
            goto LAB_001595b1;
          }
          local_158 = pRVar14;
          local_138 = malloc(sVar1);
          if (local_138 == (void *)0x0) {
            pcVar24 = "malloc send_node of REF_INT NULL";
            uVar20 = 0x4e2;
            goto LAB_001595b1;
          }
          local_188 = (REF_INT *)malloc(sVar1);
          if (local_188 == (REF_INT *)0x0) {
            pcVar24 = "malloc send_proc of REF_INT NULL";
            uVar20 = 0x4e3;
            goto LAB_001595b1;
          }
          local_140 = malloc(sVar1);
          auVar10 = _DAT_00203770;
          if (local_140 == (void *)0x0) {
            pcVar24 = "malloc my_proc of REF_INT NULL";
            uVar20 = 0x4e4;
            local_140 = (void *)0x0;
            goto LAB_001595b1;
          }
          if ((int)uVar17 != 0) {
            RVar4 = ref_mpi->id;
            lVar21 = uVar17 - 1;
            auVar26._8_4_ = (int)lVar21;
            auVar26._0_8_ = lVar21;
            auVar26._12_4_ = (int)((ulong)lVar21 >> 0x20);
            uVar18 = 0;
            auVar26 = auVar26 ^ _DAT_00203770;
            auVar28 = _DAT_00203750;
            auVar29 = _DAT_00203760;
            do {
              auVar30 = auVar29 ^ auVar10;
              iVar27 = auVar26._4_4_;
              if ((bool)(~(auVar30._4_4_ == iVar27 && auVar26._0_4_ < auVar30._0_4_ ||
                          iVar27 < auVar30._4_4_) & 1)) {
                *(REF_INT *)((long)local_140 + uVar18) = RVar4;
              }
              if ((auVar30._12_4_ != auVar26._12_4_ || auVar30._8_4_ <= auVar26._8_4_) &&
                  auVar30._12_4_ <= auVar26._12_4_) {
                *(REF_INT *)((long)local_140 + uVar18 + 4) = RVar4;
              }
              auVar30 = auVar28 ^ auVar10;
              iVar31 = auVar30._4_4_;
              if (iVar31 <= iVar27 && (iVar31 != iVar27 || auVar30._0_4_ <= auVar26._0_4_)) {
                *(REF_INT *)((long)local_140 + uVar18 + 8) = RVar4;
                *(REF_INT *)((long)local_140 + uVar18 + 0xc) = RVar4;
              }
              lVar21 = auVar29._8_8_;
              auVar29._0_8_ = auVar29._0_8_ + 4;
              auVar29._8_8_ = lVar21 + 4;
              lVar21 = auVar28._8_8_;
              auVar28._0_8_ = auVar28._0_8_ + 4;
              auVar28._8_8_ = lVar21 + 4;
              uVar18 = uVar18 + 0x10;
            } while ((uVar17 * 4 + 0xc & 0xfffffffffffffff0) != uVar18);
          }
          if (RVar22 < 1) {
            RVar22 = 0;
          }
          else {
            lVar23 = 0;
            lVar21 = 0;
            RVar22 = 0;
            pRVar14 = local_170;
            pRVar16 = local_190;
            do {
              if (ref_mpi->id == pRVar16[lVar21]) {
                lVar19 = (long)RVar22;
                local_188[lVar19] = source[lVar21];
                uVar11 = *(uint *)((long)local_130 + lVar21 * 4);
                *(uint *)((long)local_138 + lVar19 * 4) = uVar11;
                cell = *(uint *)((long)pRVar14 + lVar21 * 4);
                *(uint *)((long)local_180 + lVar19 * 4) = cell;
                if (cell == 0xffffffff) {
                  *local_118 = 1;
                }
                else {
                  uVar12 = ref_cell_nodes(local_d0,cell,nodes);
                  if (uVar12 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x4f0,"ref_interp_tree",(ulong)uVar12,"cell should be set and valid");
                    printf("global %d best cell %d best bary %e\n",local_158[lVar21],(ulong)uVar11,
                           (ulong)cell);
                    return uVar12;
                  }
                  if (local_110->twod == 0) {
                    uVar11 = ref_node_bary4(local_108,nodes,(REF_DBL *)((long)global_xyz + lVar23),
                                            (REF_DBL *)(&local_178->d + (long)(RVar22 * 4) * 2));
                    pRVar14 = local_170;
                    pRVar16 = local_190;
                    if (uVar11 != 0) {
                      uVar25 = (ulong)uVar11;
                      pcVar24 = "bary";
                      uVar20 = 0x4f9;
                      goto LAB_00159402;
                    }
                  }
                  else {
                    *(undefined8 *)(&local_178->d + (long)(RVar22 * 4 + 3) * 2) = 0;
                    uVar11 = ref_node_bary3(local_108,nodes,(REF_DBL *)((long)global_xyz + lVar23),
                                            (REF_DBL *)(&local_178->d + (long)(RVar22 * 4) * 2));
                    pRVar14 = local_170;
                    pRVar16 = local_190;
                    if (uVar11 != 0) {
                      uVar25 = (ulong)uVar11;
                      pcVar24 = "bary";
                      uVar20 = 0x4f5;
                      goto LAB_00159402;
                    }
                  }
                }
                RVar22 = RVar22 + 1;
                uVar25 = (ulong)(uint)total_node;
              }
              lVar21 = lVar21 + 1;
              lVar23 = lVar23 + 0x18;
            } while (lVar21 < (int)uVar25);
          }
          uVar11 = ref_mpi_blindsend(ref_mpi,local_188,local_138,1,RVar22,&recv_node,&nrecv,1);
          if (uVar11 == 0) {
            uVar11 = ref_mpi_blindsend(ref_mpi,local_188,local_180,1,RVar22,&recv_cell,&nrecv,1);
            if (uVar11 == 0) {
              uVar11 = ref_mpi_blindsend(ref_mpi,local_188,local_140,1,RVar22,&recv_proc,&nrecv,1);
              if (uVar11 == 0) {
                uVar11 = ref_mpi_blindsend(ref_mpi,local_188,local_178,4,RVar22,&recv_bary,&nrecv,3)
                ;
                if (uVar11 == 0) {
                  if (0 < nrecv) {
                    pRVar16 = ref_interp->cell;
                    lVar23 = 0;
                    lVar21 = 0;
                    do {
                      ref_interp->n_tree = ref_interp->n_tree + 1;
                      iVar27 = recv_node[lVar21];
                      if ((long)pRVar16[iVar27] != -1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x512,"ref_interp_tree","tree already found?",0xffffffffffffffff,
                               (long)pRVar16[iVar27]);
                        return 1;
                      }
                      if (ref_interp->agent_hired[iVar27] != 0) {
                        uVar11 = ref_agents_delete(ref_interp->ref_agents,iVar27);
                        if (uVar11 != 0) {
                          uVar25 = (ulong)uVar11;
                          pcVar24 = "deq";
                          uVar20 = 0x514;
                          goto LAB_00159402;
                        }
                        ref_interp->agent_hired[iVar27] = 0;
                        pRVar16 = ref_interp->cell;
                      }
                      pRVar16[iVar27] = recv_cell[lVar21];
                      ref_interp->part[iVar27] = recv_proc[lVar21];
                      if (recv_cell[lVar21] == -1) {
                        ref_interp->n_tree = ref_interp->n_tree + -1;
                      }
                      else {
                        pRVar14 = ref_interp->bary;
                        lVar19 = 0;
                        do {
                          pRVar14[(iVar27 << 2) + lVar19] =
                               *(REF_DBL *)((long)recv_bary + lVar19 * 8 + lVar23);
                          lVar19 = lVar19 + 1;
                        } while (lVar19 != 4);
                      }
                      lVar21 = lVar21 + 1;
                      lVar23 = lVar23 + 0x20;
                    } while (lVar21 < nrecv);
                  }
                  uVar11 = ref_mpi_allsum(ref_mpi,&ref_interp->n_tree,1,1);
                  if (uVar11 == 0) {
                    uVar11 = ref_mpi_all_or(ref_mpi,local_118);
                    if (uVar11 == 0) {
                      if (recv_node != (REF_INT *)0x0) {
                        free(recv_node);
                      }
                      if (recv_cell != (REF_INT *)0x0) {
                        free(recv_cell);
                      }
                      if (recv_proc != (REF_INT *)0x0) {
                        free(recv_proc);
                      }
                      if (recv_bary != (REF_DBL *)0x0) {
                        free(recv_bary);
                      }
                      free(local_178);
                      free(local_140);
                      free(local_180);
                      free(local_138);
                      free(local_188);
                      free(local_190);
                      free(local_170);
                      free(local_130);
                      free(local_158);
                      if (source != (REF_INT *)0x0) {
                        free(source);
                      }
                      if (global_node != (REF_INT *)0x0) {
                        free(global_node);
                      }
                      if (global_xyz != (REF_DBL *)0x0) {
                        free(global_xyz);
                      }
                      free(local_d8);
                      free(local_120);
                      uVar11 = ref_list_free(ref_list);
                      if (uVar11 == 0) {
                        if (*local_118 != 0) {
                          return 0;
                        }
                        if ((long)local_128->max < 1) {
                          return 0;
                        }
                        lVar21 = 0;
                        while (((local_128->global[lVar21] < 0 ||
                                (local_128->ref_mpi->id != local_128->part[lVar21])) ||
                               (ref_interp->cell[lVar21] != -1))) {
                          lVar21 = lVar21 + 1;
                          if (local_128->max == lVar21) {
                            return 0;
                          }
                        }
                        pcVar24 = "node missed by tree";
                        uVar20 = 0x540;
                        goto LAB_00159499;
                      }
                      uVar25 = (ulong)uVar11;
                      pcVar24 = "free list";
                      uVar20 = 0x53a;
                    }
                    else {
                      uVar25 = (ulong)uVar11;
                      pcVar24 = "sync status";
                      uVar20 = 0x522;
                    }
                  }
                  else {
                    uVar25 = (ulong)uVar11;
                    pcVar24 = "as";
                    uVar20 = 0x521;
                  }
                }
                else {
                  uVar25 = (ulong)uVar11;
                  pcVar24 = "blind send bary";
                  uVar20 = 0x50d;
                }
              }
              else {
                uVar25 = (ulong)uVar11;
                pcVar24 = "blind send proc";
                uVar20 = 0x50a;
              }
            }
            else {
              uVar25 = (ulong)uVar11;
              pcVar24 = "blind send cell";
              uVar20 = 0x507;
            }
          }
          else {
            uVar25 = (ulong)uVar11;
            pcVar24 = "blind send node";
            uVar20 = 0x504;
          }
          goto LAB_00159402;
        }
        pcVar24 = "who";
        uVar20 = 0x4da;
      }
      else {
        pcVar24 = "cat";
        uVar20 = 0x4b5;
      }
    }
    else {
      pcVar24 = "cat";
      uVar20 = 0x4b1;
    }
  }
  else {
    pcVar24 = "create list";
    uVar20 = 0x49b;
  }
LAB_001593fd:
  uVar25 = (ulong)uVar11;
LAB_00159402:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar20,
         "ref_interp_tree",uVar25,pcVar24);
  return (REF_STATUS)uVar25;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_tree(REF_INTERP ref_interp,
                                          REF_BOOL *increase_fuzz) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_SEARCH ref_search = ref_interp_search(ref_interp);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  *increase_fuzz = REF_FALSE;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }
  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use max*/
    RSS(ref_search_touching(ref_search, ref_list, &(global_xyz[3 * node]),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(from_grid)) {
        RSS(ref_interp_enclosing_tri_in_list(ref_interp, ref_list,
                                             &(global_xyz[3 * node]),
                                             &(best_cell[node]), bary),
            "best in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(ref_interp, ref_list,
                                             &(global_xyz[3 * node]),
                                             &(best_cell[node]), bary),
            "best in list");
      }
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use max*/
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_cell, best_cell[node], nodes),
            "cell should be set and valid", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        if (ref_grid_twod(from_grid)) {
          send_bary[3 + 4 * nsend] = 0.0;
          RSS(ref_node_bary3(from_node, nodes, &(global_xyz[3 * node]),
                             &(send_bary[4 * nsend])),
              "bary");
        } else {
          RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                             &(send_bary[4 * nsend])),
              "bary");
        }
      } else {
        *increase_fuzz =
            REF_TRUE; /* candidate not found, try again larger fuzz */
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
    } else {
      (ref_interp->n_tree)--;
    }
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_tree), 1, REF_INT_TYPE), "as");
  RSS(ref_mpi_all_or(ref_mpi, increase_fuzz), "sync status");

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  if (!(*increase_fuzz)) {
    each_ref_node_valid_node(to_node, node) {
      if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
        continue;
      RUS(REF_EMPTY, ref_interp->cell[node], "node missed by tree");
    }
  }

  return REF_SUCCESS;
}